

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall Assimp::LWO::AnimResolver::ClearAnimRangeSetup(AnimResolver *this)

{
  list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *plVar1;
  _List_node_base *p_Var2;
  
  plVar1 = this->envelopes;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)p_Var2)->
                  super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>).
                  _M_impl._M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)plVar1
        ) {
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::erase
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)(p_Var2 + 2),
               *(Key **)(p_Var2 + 2),
               *(Key **)(p_Var2 + 2) + (long)*(_List_node_base **)((long)(p_Var2 + 3) + 8));
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::erase
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)(p_Var2 + 2),
               (Key *)(*(long *)(p_Var2 + 2) + *(long *)(p_Var2 + 4) * 0x28 + 0x28),
               *(Key **)((long)(p_Var2 + 2) + 8));
    plVar1 = this->envelopes;
  }
  return;
}

Assistant:

void AnimResolver::ClearAnimRangeSetup()
{
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).keys.erase((*it).keys.begin(),(*it).keys.begin()+(*it).old_first);
        (*it).keys.erase((*it).keys.begin()+(*it).old_last+1,(*it).keys.end());
    }
}